

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_writeCTable(void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog
                      )

{
  uint uVar1;
  uint tableLog;
  size_t sVar2;
  ulong uVar3;
  char *buffer;
  ulong srcSize;
  char *pcStack_300;
  uint maxSymbolValue_1;
  uint local_2ec;
  size_t local_2e8;
  size_t local_2e0;
  BYTE bitsToWeight [13];
  short local_2c8 [16];
  uint count [13];
  BYTE huffWeight [255];
  BYTE scratchBuffer [64];
  FSE_CTable CTable_1 [59];
  
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  bitsToWeight[0] = '\0';
  uVar1 = huffLog + 1;
  for (uVar3 = 1; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    bitsToWeight[uVar3] = (BYTE)huffLog;
    huffLog = (uint)(byte)((BYTE)huffLog - 1);
  }
  srcSize = (ulong)maxSymbolValue;
  for (uVar3 = 0; srcSize != uVar3; uVar3 = uVar3 + 1) {
    huffWeight[uVar3] = bitsToWeight[CTable[uVar3].nbBits];
  }
  buffer = (char *)((long)dst + 1);
  maxSymbolValue_1 = 0xc;
  if (1 < maxSymbolValue) {
    uVar1 = HIST_count_simple(count,&maxSymbolValue_1,huffWeight,srcSize);
    local_2ec = maxSymbolValue_1;
    if (uVar1 == maxSymbolValue) {
      pcStack_300 = (char *)0x1;
      goto LAB_00107de7;
    }
    if (uVar1 != 1) {
      tableLog = FSE_optimalTableLog(6,srcSize,maxSymbolValue_1);
      sVar2 = FSE_normalizeCount(local_2c8,tableLog,count,srcSize,local_2ec);
      uVar1 = local_2ec;
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
      local_2e0 = maxDstSize - 1;
      local_2e8 = FSE_writeNCount(buffer,local_2e0,local_2c8,local_2ec,tableLog);
      if (0xffffffffffffff88 < local_2e8) {
        return local_2e8;
      }
      sVar2 = FSE_buildCTable_wksp(CTable_1,local_2c8,uVar1,tableLog,scratchBuffer,0x40);
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
      pcStack_300 = buffer + local_2e8;
      sVar2 = FSE_compress_usingCTable
                        (pcStack_300,local_2e0 - local_2e8,huffWeight,srcSize,CTable_1);
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
      if (sVar2 != 0) {
        pcStack_300 = pcStack_300 + (sVar2 - (long)buffer);
        if ((char *)0xffffffffffffff88 < pcStack_300) {
          return (size_t)pcStack_300;
        }
        goto LAB_00107de7;
      }
    }
  }
  pcStack_300 = (char *)0x0;
LAB_00107de7:
  if (pcStack_300 < (char *)(ulong)(maxSymbolValue >> 1) && (char *)0x1 < pcStack_300) {
    *(char *)dst = (char)pcStack_300;
    pcStack_300 = pcStack_300 + 1;
  }
  else if (maxSymbolValue < 0x81) {
    pcStack_300 = (char *)(ulong)((maxSymbolValue + 1 >> 1) + 1);
    if (maxDstSize < pcStack_300) {
      pcStack_300 = (char *)0xffffffffffffffba;
    }
    else {
      *(char *)dst = (char)maxSymbolValue + '\x7f';
      huffWeight[srcSize] = '\0';
      for (uVar3 = 0; uVar3 < srcSize; uVar3 = uVar3 + 2) {
        *buffer = huffWeight[uVar3] * '\x10' + huffWeight[uVar3 + 1];
        buffer = buffer + 1;
      }
    }
  }
  else {
    pcStack_300 = (char *)0xffffffffffffffff;
  }
  return (size_t)pcStack_300;
}

Assistant:

size_t HUF_writeCTable (void* dst, size_t maxDstSize,
                        const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog)
{
    BYTE bitsToWeight[HUF_TABLELOG_MAX + 1];   /* precomputed conversion table */
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX];
    BYTE* op = (BYTE*)dst;
    U32 n;

     /* check conditions */
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        huffWeight[n] = bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, huffWeight, maxSymbolValue) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((huffWeight[n] << 4) + huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}